

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  int iVar1;
  long lVar2;
  xmlChar *pxVar3;
  xmlXPathObjectPtr pxVar4;
  xmlXPathObjectPtr pxVar5;
  int iVar6;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs < 2) {
    iVar6 = 0xc;
  }
  else {
    if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
      xmlXPathStringFunction(ctxt,1);
    }
    iVar6 = ctxt->valueNr;
    lVar2 = (long)iVar6;
    if (lVar2 < 1) {
      pxVar4 = (xmlXPathObjectPtr)0x0;
    }
    else {
      ctxt->valueNr = iVar6 + -1;
      if (iVar6 == 1) {
        pxVar4 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar4 = ctxt->valueTab[lVar2 + -2];
      }
      ctxt->value = pxVar4;
      pxVar4 = ctxt->valueTab[lVar2 + -1];
      ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
    }
    if ((pxVar4 == (xmlXPathObjectPtr)0x0) || (pxVar4->type != XPATH_STRING)) {
      xmlXPathReleaseObject(ctxt->context,pxVar4);
      return;
    }
    iVar6 = nargs + 1;
    while( true ) {
      if ((ctxt->value != (xmlXPathObjectPtr)0x0) && (ctxt->value->type != XPATH_STRING)) {
        xmlXPathStringFunction(ctxt,1);
      }
      iVar1 = ctxt->valueNr;
      lVar2 = (long)iVar1;
      if (lVar2 < 1) {
        pxVar5 = (xmlXPathObjectPtr)0x0;
      }
      else {
        ctxt->valueNr = iVar1 + -1;
        if (iVar1 == 1) {
          pxVar5 = (xmlXPathObjectPtr)0x0;
        }
        else {
          pxVar5 = ctxt->valueTab[lVar2 + -2];
        }
        ctxt->value = pxVar5;
        pxVar5 = ctxt->valueTab[lVar2 + -1];
        ctxt->valueTab[lVar2 + -1] = (xmlXPathObjectPtr)0x0;
      }
      if ((pxVar5 == (xmlXPathObjectPtr)0x0) || (pxVar5->type != XPATH_STRING)) break;
      pxVar3 = xmlStrcat(pxVar5->stringval,pxVar4->stringval);
      if (pxVar3 == (xmlChar *)0x0) {
        xmlXPathPErrMemory(ctxt);
      }
      pxVar5->stringval = pxVar4->stringval;
      pxVar4->stringval = pxVar3;
      xmlXPathReleaseObject(ctxt->context,pxVar5);
      iVar6 = iVar6 + -1;
      if (iVar6 < 3) {
        xmlXPathValuePush(ctxt,pxVar4);
        return;
      }
    }
    xmlXPathReleaseObject(ctxt->context,pxVar5);
    xmlXPathReleaseObject(ctxt->context,pxVar4);
    iVar6 = 0xb;
  }
  xmlXPathErr(ctxt,iVar6);
  return;
}

Assistant:

void
xmlXPathConcatFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr cur, newobj;
    xmlChar *tmp;

    if (ctxt == NULL) return;
    if (nargs < 2) {
	CHECK_ARITY(2);
    }

    CAST_TO_STRING;
    cur = xmlXPathValuePop(ctxt);
    if ((cur == NULL) || (cur->type != XPATH_STRING)) {
	xmlXPathReleaseObject(ctxt->context, cur);
	return;
    }
    nargs--;

    while (nargs > 0) {
	CAST_TO_STRING;
	newobj = xmlXPathValuePop(ctxt);
	if ((newobj == NULL) || (newobj->type != XPATH_STRING)) {
	    xmlXPathReleaseObject(ctxt->context, newobj);
	    xmlXPathReleaseObject(ctxt->context, cur);
	    XP_ERROR(XPATH_INVALID_TYPE);
	}
	tmp = xmlStrcat(newobj->stringval, cur->stringval);
        if (tmp == NULL)
            xmlXPathPErrMemory(ctxt);
	newobj->stringval = cur->stringval;
	cur->stringval = tmp;
	xmlXPathReleaseObject(ctxt->context, newobj);
	nargs--;
    }
    xmlXPathValuePush(ctxt, cur);
}